

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O2

void test_dt_byte(void)

{
  char cVar1;
  bool bVar2;
  XSValue *pXVar3;
  char *pcVar4;
  wchar16 *pwVar5;
  long lVar6;
  char *pcVar7;
  void *pvVar8;
  int iVar9;
  int iVar10;
  Status myStatus;
  StrX local_c8;
  char lex_v_ran_iv_2 [5];
  char lex_v_ran_iv_1 [5];
  Status myStatus_14;
  char lex_v_ran_v_2 [5];
  char lex_v_ran_v_1 [5];
  char lex_iv_2 [8];
  char lex_iv_1 [9];
  char lex_v_ran_iv_2_canrep [5];
  char lex_v_ran_v_2_canrep [5];
  char data_canrep_2 [4];
  char data_canrep_1 [4];
  char lex_v_ran_iv_1_canrep [4];
  char lex_v_ran_v_1_canrep [4];
  char data_rawstr_2 [7];
  char data_rawstr_1 [12];
  char lex_v_ran_v_0 [10];
  
  builtin_strncpy(lex_v_ran_v_0,"   12   \n",10);
  builtin_strncpy(lex_v_ran_v_1,"+127",5);
  builtin_strncpy(lex_v_ran_v_2,"-128",5);
  builtin_strncpy(lex_v_ran_iv_1,"+128",5);
  builtin_strncpy(lex_v_ran_iv_2,"-129",5);
  builtin_strncpy(lex_v_ran_v_1_canrep,"127",4);
  builtin_strncpy(lex_v_ran_v_2_canrep,"-128",5);
  builtin_strncpy(lex_v_ran_iv_1_canrep,"128",4);
  builtin_strncpy(lex_v_ran_iv_2_canrep,"-129",5);
  builtin_strncpy(lex_iv_1,"1234.456",9);
  builtin_strncpy(lex_iv_2,"1234b56",8);
  builtin_strncpy(data_rawstr_1,"   +123   \n",0xc);
  builtin_strncpy(data_canrep_1,"123",4);
  builtin_strncpy(data_rawstr_2,"000123",7);
  builtin_strncpy(data_canrep_2,"123",4);
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_c8,lex_v_ran_v_0);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_c8.fUnicodeForm,dt_byte,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_c8);
  if (cVar1 == '\0') {
    StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x8bc,lex_v_ran_v_0,local_c8.fLocalForm,1);
    StrX::~StrX(&local_c8);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_c8,lex_v_ran_v_1);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_c8.fUnicodeForm,dt_byte,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_c8);
  if (cVar1 == '\0') {
    StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x8bd,lex_v_ran_v_1,local_c8.fLocalForm,1);
    StrX::~StrX(&local_c8);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_c8,lex_v_ran_v_2);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_c8.fUnicodeForm,dt_byte,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_c8);
  if (cVar1 == '\0') {
    StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x8be,lex_v_ran_v_2,local_c8.fLocalForm,1);
    StrX::~StrX(&local_c8);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_c8,lex_v_ran_iv_1);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_c8.fUnicodeForm,dt_byte,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_c8);
  if (cVar1 == '\0') {
    if (myStatus != st_FOCA0002) {
      StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      pcVar7 = local_c8.fLocalForm;
      pcVar4 = getStatusString(myStatus);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x8c1,lex_v_ran_iv_1,pcVar7,"st_FOCA0002",pcVar4);
      goto LAB_0011163f;
    }
  }
  else {
    StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x8c1,lex_v_ran_iv_1,local_c8.fLocalForm,0);
LAB_0011163f:
    StrX::~StrX(&local_c8);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_c8,lex_v_ran_iv_2);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_c8.fUnicodeForm,dt_byte,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_c8);
  if (cVar1 == '\0') {
    if (myStatus != st_FOCA0002) {
      StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      pcVar7 = local_c8.fLocalForm;
      pcVar4 = getStatusString(myStatus);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x8c2,lex_v_ran_iv_2,pcVar7,"st_FOCA0002",pcVar4);
      goto LAB_0011170d;
    }
  }
  else {
    StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x8c2,lex_v_ran_iv_2,local_c8.fLocalForm,0);
LAB_0011170d:
    StrX::~StrX(&local_c8);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_c8,lex_iv_1);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_c8.fUnicodeForm,dt_byte,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_c8);
  if (cVar1 == '\0') {
    if (myStatus != st_FOCA0002) {
      StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      pcVar7 = local_c8.fLocalForm;
      pcVar4 = getStatusString(myStatus);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x8c5,lex_iv_1,pcVar7,"st_FOCA0002",pcVar4);
      goto LAB_001117db;
    }
  }
  else {
    StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x8c5,lex_iv_1,local_c8.fLocalForm,0);
LAB_001117db:
    StrX::~StrX(&local_c8);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_c8,lex_iv_2);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_c8.fUnicodeForm,dt_byte,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_c8);
  if (cVar1 == '\0') {
    if (myStatus != st_FOCA0002) {
      StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      pcVar7 = local_c8.fLocalForm;
      pcVar4 = getStatusString(myStatus);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x8c6,lex_iv_2,pcVar7,"st_FOCA0002",pcVar4);
      goto LAB_001118a9;
    }
  }
  else {
    StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x8c6,lex_iv_2,local_c8.fLocalForm,0);
LAB_001118a9:
    StrX::~StrX(&local_c8);
    errSeen = 1;
  }
  iVar10 = 2;
  while (iVar9 = iVar10 + -1, iVar10 != 0) {
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_c8,lex_v_ran_v_0);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_c8.fUnicodeForm,dt_byte,&myStatus,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_c8);
    if (pXVar3 == (XSValue *)0x0) {
      StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x8e3,lex_v_ran_v_0);
      StrX::~StrX(&local_c8);
      errSeen = 1;
    }
    else {
      pvVar8 = (void *)(ulong)(uint)(int)(char)pXVar3[8];
      if ((int)(char)pXVar3[8] != 0xc) {
        printf("ACTVALUE_TEST Unexpected dt_byte XSValue, got %d expected %d\n",pvVar8,0xc);
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar8);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_c8,lex_v_ran_v_1);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_c8.fUnicodeForm,dt_byte,&myStatus,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_c8);
    if (pXVar3 == (XSValue *)0x0) {
      StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x8e5,lex_v_ran_v_1);
      StrX::~StrX(&local_c8);
      errSeen = 1;
    }
    else {
      pvVar8 = (void *)(ulong)(uint)(int)(char)pXVar3[8];
      if ((int)(char)pXVar3[8] != 0x7f) {
        printf("ACTVALUE_TEST Unexpected dt_byte XSValue, got %d expected %d\n",pvVar8,0x7f);
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar8);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_c8,lex_v_ran_v_2);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_c8.fUnicodeForm,dt_byte,&myStatus,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_c8);
    if (pXVar3 == (XSValue *)0x0) {
      StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x8e6,lex_v_ran_v_2);
      StrX::~StrX(&local_c8);
      errSeen = 1;
    }
    else {
      pvVar8 = (void *)(ulong)(uint)(int)(char)pXVar3[8];
      if ((int)(char)pXVar3[8] != 0xffffff80) {
        printf("ACTVALUE_TEST Unexpected dt_byte XSValue, got %d expected %d\n",pvVar8,
               0xffffffffffffff80);
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar8);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_c8,lex_v_ran_iv_1);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_c8.fUnicodeForm,dt_byte,&myStatus,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_c8);
    if (pXVar3 == (XSValue *)0x0) {
      if (myStatus != st_FOCA0002) {
        StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
        pcVar7 = local_c8.fLocalForm;
        pcVar4 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x8e7,lex_v_ran_iv_1,pcVar7,"st_FOCA0002",pcVar4);
        StrX::~StrX(&local_c8);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      pvVar8 = (void *)0x8e7;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x8e7,lex_v_ran_iv_1);
      StrX::~StrX(&local_c8);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar8);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_c8,lex_v_ran_iv_2);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_c8.fUnicodeForm,dt_byte,&myStatus,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_c8);
    if (pXVar3 == (XSValue *)0x0) {
      if (myStatus != st_FOCA0002) {
        StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
        pcVar7 = local_c8.fLocalForm;
        pcVar4 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x8e8,lex_v_ran_iv_2,pcVar7,"st_FOCA0002",pcVar4);
        StrX::~StrX(&local_c8);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      pvVar8 = (void *)0x8e8;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x8e8,lex_v_ran_iv_2);
      StrX::~StrX(&local_c8);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar8);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_c8,lex_iv_1);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_c8.fUnicodeForm,dt_byte,&myStatus,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_c8);
    if (pXVar3 == (XSValue *)0x0) {
      if (myStatus != st_FOCA0002) {
        StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
        pcVar7 = local_c8.fLocalForm;
        pcVar4 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x8ea,lex_iv_1,pcVar7,"st_FOCA0002",pcVar4);
        StrX::~StrX(&local_c8);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      pvVar8 = (void *)0x8ea;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x8ea,lex_iv_1);
      StrX::~StrX(&local_c8);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar8);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_c8,lex_iv_2);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_c8.fUnicodeForm,dt_byte,&myStatus,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_c8);
    iVar10 = iVar9;
    if (pXVar3 == (XSValue *)0x0) {
      if (myStatus != st_FOCA0002) {
        StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
        pcVar7 = local_c8.fLocalForm;
        pcVar4 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x8eb,lex_iv_2,pcVar7,"st_FOCA0002",pcVar4);
        StrX::~StrX(&local_c8);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      pvVar8 = (void *)0x8eb;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x8eb,lex_iv_2);
      StrX::~StrX(&local_c8);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar8);
    }
  }
  iVar10 = 2;
LAB_00111ee8:
  iVar9 = iVar10 + -1;
  if (iVar10 != 0) {
    myStatus_14 = st_Init;
    StrX::StrX(&local_c8,data_rawstr_1);
    pwVar5 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_c8.fUnicodeForm,dt_byte,&myStatus_14,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_c8);
    if (pwVar5 == (wchar16 *)0x0) {
      StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x909,data_rawstr_1);
      StrX::~StrX(&local_c8);
      errSeen = 1;
    }
    else {
      _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar5,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(_myStatus,data_canrep_1);
      if (!bVar2) {
        StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x909,data_rawstr_1,local_c8.fLocalForm,_myStatus,data_canrep_1);
        StrX::~StrX(&local_c8);
        errSeen = 1;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar5);
      xercesc_4_0::XMLString::release
                ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    myStatus_14 = st_Init;
    StrX::StrX(&local_c8,data_rawstr_2);
    pwVar5 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_c8.fUnicodeForm,dt_byte,&myStatus_14,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_c8);
    if (pwVar5 == (wchar16 *)0x0) {
      StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x90a,data_rawstr_2);
      StrX::~StrX(&local_c8);
      errSeen = 1;
    }
    else {
      _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar5,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(_myStatus,data_canrep_2);
      if (!bVar2) {
        StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x90a,data_rawstr_2,local_c8.fLocalForm,_myStatus,data_canrep_2);
        StrX::~StrX(&local_c8);
        errSeen = 1;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar5);
      xercesc_4_0::XMLString::release
                ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    myStatus_14 = st_Init;
    StrX::StrX(&local_c8,lex_v_ran_v_1);
    pwVar5 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_c8.fUnicodeForm,dt_byte,&myStatus_14,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_c8);
    if (pwVar5 == (wchar16 *)0x0) {
      StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x90c,lex_v_ran_v_1);
      StrX::~StrX(&local_c8);
      errSeen = 1;
    }
    else {
      _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar5,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(_myStatus,lex_v_ran_v_1_canrep);
      if (!bVar2) {
        StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x90c,lex_v_ran_v_1,local_c8.fLocalForm,_myStatus,lex_v_ran_v_1_canrep);
        StrX::~StrX(&local_c8);
        errSeen = 1;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar5);
      xercesc_4_0::XMLString::release
                ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    myStatus_14 = st_Init;
    StrX::StrX(&local_c8,lex_v_ran_v_2);
    pwVar5 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_c8.fUnicodeForm,dt_byte,&myStatus_14,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_c8);
    if (pwVar5 == (wchar16 *)0x0) {
      StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x90d,lex_v_ran_v_2);
      StrX::~StrX(&local_c8);
      errSeen = 1;
    }
    else {
      _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar5,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(_myStatus,lex_v_ran_v_2_canrep);
      if (!bVar2) {
        StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x90d,lex_v_ran_v_2,local_c8.fLocalForm,_myStatus,lex_v_ran_v_2_canrep);
        StrX::~StrX(&local_c8);
        errSeen = 1;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar5);
      xercesc_4_0::XMLString::release
                ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_c8,lex_iv_1);
    lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_c8.fUnicodeForm,dt_byte,&myStatus,ver_10,iVar10 == 2,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_c8);
    if (lVar6 == 0) {
      if (myStatus != st_FOCA0002) {
        StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
        pcVar7 = local_c8.fLocalForm;
        pcVar4 = getStatusString(myStatus);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x90f,lex_iv_1,pcVar7,"st_FOCA0002",pcVar4);
        StrX::~StrX(&local_c8);
        goto LAB_00112411;
      }
    }
    else {
      StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x90f,lex_iv_1);
      StrX::~StrX(&local_c8);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
LAB_00112411:
      errSeen = 1;
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_c8,lex_iv_2);
    lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_c8.fUnicodeForm,dt_byte,&myStatus,ver_10,iVar10 == 2,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_c8);
    iVar10 = iVar9;
    if (lVar6 == 0) goto LAB_001124a2;
    StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x910,lex_iv_2);
    StrX::~StrX(&local_c8);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
    goto LAB_001124f3;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_c8,lex_v_ran_iv_1);
  lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_c8.fUnicodeForm,dt_byte,&myStatus,ver_10,true,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_c8);
  if (lVar6 == 0) {
    if (myStatus != st_FOCA0002) {
      StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      pcVar7 = local_c8.fLocalForm;
      pcVar4 = getStatusString(myStatus);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x915,lex_v_ran_iv_1,pcVar7,"st_FOCA0002",pcVar4);
      StrX::~StrX(&local_c8);
      goto LAB_001125e2;
    }
  }
  else {
    StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x915,lex_v_ran_iv_1);
    StrX::~StrX(&local_c8);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
LAB_001125e2:
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_c8,lex_v_ran_iv_2);
  lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_c8.fUnicodeForm,dt_byte,&myStatus,ver_10,true,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_c8);
  if (lVar6 == 0) {
    if (myStatus == st_FOCA0002) goto LAB_001126d0;
    StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
    pcVar7 = local_c8.fLocalForm;
    pcVar4 = getStatusString(myStatus);
    printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
           ,0x916,lex_v_ran_iv_2,pcVar7,"st_FOCA0002",pcVar4);
    StrX::~StrX(&local_c8);
  }
  else {
    StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x916,lex_v_ran_iv_2);
    StrX::~StrX(&local_c8);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
  }
  errSeen = 1;
LAB_001126d0:
  myStatus_14 = st_Init;
  StrX::StrX(&local_c8,lex_v_ran_iv_1);
  pwVar5 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_c8.fUnicodeForm,dt_byte,&myStatus_14,ver_10,false,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_c8);
  if (pwVar5 == (wchar16 *)0x0) {
    StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x919,lex_v_ran_iv_1);
    StrX::~StrX(&local_c8);
    errSeen = 1;
  }
  else {
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (pwVar5,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    _myStatus = pcVar7;
    bVar2 = xercesc_4_0::XMLString::equals(pcVar7,lex_v_ran_iv_1_canrep);
    if (!bVar2) {
      StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0x919,lex_v_ran_iv_1,local_c8.fLocalForm,pcVar7,lex_v_ran_iv_1_canrep);
      StrX::~StrX(&local_c8);
      errSeen = 1;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar5);
    xercesc_4_0::XMLString::release
              ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  myStatus_14 = st_Init;
  StrX::StrX(&local_c8,lex_v_ran_iv_2);
  pwVar5 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_c8.fUnicodeForm,dt_byte,&myStatus_14,ver_10,false,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_c8);
  if (pwVar5 == (wchar16 *)0x0) {
    StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x91a,lex_v_ran_iv_2,local_c8.fLocalForm);
    StrX::~StrX(&local_c8);
    errSeen = 1;
  }
  else {
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (pwVar5,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    _myStatus = pcVar7;
    bVar2 = xercesc_4_0::XMLString::equals(pcVar7,lex_v_ran_iv_2_canrep);
    if (!bVar2) {
      StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0x91a,lex_v_ran_iv_2,local_c8.fLocalForm,pcVar7,lex_v_ran_iv_2_canrep);
      StrX::~StrX(&local_c8);
      errSeen = 1;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar5);
    xercesc_4_0::XMLString::release
              ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  return;
LAB_001124a2:
  if (myStatus != st_FOCA0002) {
    StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
    pcVar7 = local_c8.fLocalForm;
    pcVar4 = getStatusString(myStatus);
    printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
           ,0x910,lex_iv_2,pcVar7,"st_FOCA0002",pcVar4);
    StrX::~StrX(&local_c8);
LAB_001124f3:
    errSeen = 1;
  }
  goto LAB_00111ee8;
}

Assistant:

void test_dt_byte()
{
    const XSValue::DataType dt = XSValue::dt_byte;
    bool  toValidate = true;

    const char lex_v_ran_v_0[]="   12   \n";

    const char lex_v_ran_v_1[]="+127";
    const char lex_v_ran_v_2[]="-128";
    const char lex_v_ran_iv_1[]="+128";
    const char lex_v_ran_iv_2[]="-129";

    XSValue::XSValue_Data act_v_ran_v_0;   act_v_ran_v_0.fValue.f_char = (char)12;
    XSValue::XSValue_Data act_v_ran_v_1;   act_v_ran_v_1.fValue.f_char = (char)+127;
    XSValue::XSValue_Data act_v_ran_v_2;   act_v_ran_v_2.fValue.f_char = (char)-128;

    const char lex_v_ran_v_1_canrep[]="127";
    const char lex_v_ran_v_2_canrep[]="-128";
    const char lex_v_ran_iv_1_canrep[]="128";
    const char lex_v_ran_iv_2_canrep[]="-129";

    const char lex_iv_1[]="1234.456";
    const char lex_iv_2[]="1234b56";

/***
 *
 * 3.3.19.2 Canonical representation
 *
 * The canonical representation for byte is defined by prohibiting certain options from the
 * Lexical representation (3.3.19.1). Specifically,
 * 1. the the optional "+" sign is prohibited and
 * 2. leading zeroes are prohibited.
 *
 ***/

    const char data_rawstr_1[]="   +123   \n";
    const char data_canrep_1[]="123";
    const char data_rawstr_2[]="000123";
    const char data_canrep_2[]="123";

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *    lexical valid
     *            range  valid                           true              n/a
     *            range  invalid                         false           st_FOCA0002
     *    lexical invalid                                false           st_FOCA0002
     *
     ***/

    // lexical valid, valid range
    VALIDATE_TEST(lex_v_ran_v_0  , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_1  , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_2  , dt, EXP_RET_VALID_TRUE, DONT_CARE);

    // lexical valid, invalid range
    VALIDATE_TEST(lex_v_ran_iv_1 , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_v_ran_iv_2 , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    // lexical invalid
    VALIDATE_TEST(lex_iv_1         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_iv_2         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        ACTVALUE_TEST(lex_v_ran_v_0,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_0);

        ACTVALUE_TEST(lex_v_ran_v_1,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_1);
        ACTVALUE_TEST(lex_v_ran_v_2,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_2);
        ACTVALUE_TEST(lex_v_ran_iv_1, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
        ACTVALUE_TEST(lex_v_ran_iv_2, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);

        ACTVALUE_TEST(lex_iv_1,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
        ACTVALUE_TEST(lex_iv_2,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XMLCh          n/a
     *          range  invalid                              0            st_FOCA0002
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XMLCh         n/a
     *          range  invalid                            XMLCh         n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j)? true : false;

        CANREP_TEST(data_rawstr_1, dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_1,        DONT_CARE);
        CANREP_TEST(data_rawstr_2, dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_2,        XSValue::st_FOCA0002);

        CANREP_TEST(lex_v_ran_v_1, dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_v_1_canrep, DONT_CARE);
        CANREP_TEST(lex_v_ran_v_2, dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_v_2_canrep, DONT_CARE);

        CANREP_TEST(lex_iv_1,      dt, toValidate, EXP_RET_CANREP_FALSE, null_string,          XSValue::st_FOCA0002);
        CANREP_TEST(lex_iv_2,      dt, toValidate, EXP_RET_CANREP_FALSE, null_string,          XSValue::st_FOCA0002);

    }

    //validation on
    CANREP_TEST(lex_v_ran_iv_1, dt, true,  EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);
    CANREP_TEST(lex_v_ran_iv_2, dt, true,  EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);

    //validation off
    CANREP_TEST(lex_v_ran_iv_1, dt, false, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_1_canrep, DONT_CARE);
    CANREP_TEST(lex_v_ran_iv_2, dt, false, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_2_canrep, DONT_CARE);
}